

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::ChangeArrayTypeToNativeArray<int>
          (JavascriptArray *this,JavascriptArray *varArray,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  DynamicType *pDVar5;
  JavascriptLibrary *pJVar6;
  DynamicType *pDVar7;
  DynamicTypeHandler *pDVar8;
  Type *this_00;
  undefined4 *puVar9;
  DynamicTypeHandler *typeHandler;
  ScriptContext *scriptContext_local;
  JavascriptArray *varArray_local;
  JavascriptArray *this_local;
  
  bVar2 = VarIs<Js::JavascriptNativeArray,Js::JavascriptArray>(varArray);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x756,"(!VarIs<JavascriptNativeArray>(varArray))",
                                "Ensure that the incoming Array is a Var array");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pDVar5 = (DynamicType *)RecyclableObject::GetType((RecyclableObject *)varArray);
  pJVar6 = ScriptContext::GetLibrary(scriptContext);
  pDVar7 = JavascriptLibrary::GetArrayType(pJVar6);
  if (pDVar5 == pDVar7) {
    pJVar6 = ScriptContext::GetLibrary(scriptContext);
    pDVar5 = JavascriptLibrary::GetNativeIntArrayType(pJVar6);
    Memory::WriteBarrierPtr<Js::Type>::operator=
              (&(varArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type,
               &pDVar5->super_Type);
  }
  else {
    pDVar5 = DynamicObject::GetDynamicType((DynamicObject *)varArray);
    bVar2 = DynamicType::GetIsLocked(pDVar5);
    if (bVar2) {
      pDVar5 = DynamicObject::GetDynamicType((DynamicObject *)varArray);
      pDVar8 = DynamicType::GetTypeHandler(pDVar5);
      iVar3 = (*pDVar8->_vptr_DynamicTypeHandler[0x4e])();
      if (iVar3 == 0) {
        DynamicObject::ChangeType((DynamicObject *)varArray);
      }
      else {
        (*pDVar8->_vptr_DynamicTypeHandler[0x4a])(pDVar8,varArray);
      }
    }
    this_00 = RecyclableObject::GetType((RecyclableObject *)varArray);
    Js::Type::SetTypeId(this_00,TypeIds_NativeIntArray);
  }
  BVar4 = CrossSite::IsCrossSiteObjectTyped<Js::JavascriptArray>(varArray);
  if (BVar4 == 0) {
    bVar2 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(varArray);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x778,
                                  "(VirtualTableInfo<JavascriptArray>::HasVirtualTable(varArray))",
                                  "VirtualTableInfo<JavascriptArray>::HasVirtualTable(varArray)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    VirtualTableInfo<Js::JavascriptNativeIntArray>::SetVirtualTable(varArray);
  }
  else {
    bVar2 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptArray>_>::HasVirtualTable(varArray);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x773,
                                  "(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(varArray))"
                                  ,
                                  "VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(varArray)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::SetVirtualTable(varArray);
  }
  return;
}

Assistant:

void JavascriptArray::ChangeArrayTypeToNativeArray<int32>(JavascriptArray * varArray, ScriptContext * scriptContext)
    {
        AssertMsg(!VarIs<JavascriptNativeArray>(varArray), "Ensure that the incoming Array is a Var array");

        if (varArray->GetType() == scriptContext->GetLibrary()->GetArrayType())
        {
            varArray->type = scriptContext->GetLibrary()->GetNativeIntArrayType();
        }
        else
        {
            if (varArray->GetDynamicType()->GetIsLocked())
            {
                DynamicTypeHandler *typeHandler = varArray->GetDynamicType()->GetTypeHandler();
                if (typeHandler->IsPathTypeHandler())
                {
                    // We can't allow a type with the new type ID to be promoted to the old type.
                    // So go to a dictionary type handler, which will orphan the new type.
                    // This should be a corner case, so the inability to share the new type is unlikely to matter.
                    // If it does matter, try building a path from the new type's built-in root.
                    static_cast<PathTypeHandlerBase*>(typeHandler)->ResetTypeHandler(varArray);
                }
                else
                {
                    varArray->ChangeType();
                }
            }
            varArray->GetType()->SetTypeId(TypeIds_NativeIntArray);
        }

        if (CrossSite::IsCrossSiteObjectTyped(varArray))
        {
            Assert(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(varArray));
            VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::SetVirtualTable(varArray);
        }
        else
        {
            Assert(VirtualTableInfo<JavascriptArray>::HasVirtualTable(varArray));
            VirtualTableInfo<JavascriptNativeIntArray>::SetVirtualTable(varArray);
        }
    }